

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

void sdf_shape_done(SDF_Shape **shape)

{
  SDF_Contour *local_28;
  SDF_Contour *temp;
  SDF_Contour *contours;
  FT_Memory memory;
  SDF_Shape **shape_local;
  
  if ((shape != (SDF_Shape **)0x0) && (*shape != (SDF_Shape *)0x0)) {
    contours = (SDF_Contour *)(*shape)->memory;
    temp = (*shape)->contours;
    memory = (FT_Memory)shape;
    if ((FT_Memory)contours != (FT_Memory)0x0) {
      while (temp != (SDF_Contour *)0x0) {
        local_28 = temp;
        temp = temp->next;
        sdf_contour_done((FT_Memory)contours,&local_28);
      }
      ft_mem_free((FT_Memory)contours,memory->user);
      memory->user = (void *)0x0;
    }
  }
  return;
}

Assistant:

static void
  sdf_shape_done( SDF_Shape**  shape )
  {
    FT_Memory     memory;
    SDF_Contour*  contours;
    SDF_Contour*  temp;


    if ( !shape || !*shape )
      return;

    memory   = (*shape)->memory;
    contours = (*shape)->contours;

    if ( !memory )
      return;

    /* release all contours */
    while ( contours )
    {
      temp     = contours;
      contours = contours->next;

      sdf_contour_done( memory, &temp );
    }

    /* release the allocated shape struct  */
    FT_FREE( *shape );
  }